

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

void __thiscall State::handle(State *this,Event *event)

{
  pointer *ppIVar1;
  iterator __position;
  mapped_type *pmVar2;
  pair<std::_Rb_tree_iterator<std::pair<const_int,_State::ClientData>_>,_std::_Rb_tree_iterator<std::pair<const_int,_State::ClientData>_>_>
  pVar3;
  InputEvent local_38;
  
  switch(event->type) {
  case Connected:
    pmVar2 = std::
             map<int,_State::ClientData,_std::less<int>,_std::allocator<std::pair<const_int,_State::ClientData>_>_>
             ::operator[](&this->clients,&event->clientId);
    std::__cxx11::string::_M_assign((string *)&pmVar2->ip);
    return;
  case Disconnected:
    pVar3 = std::
            _Rb_tree<int,_std::pair<const_int,_State::ClientData>,_std::_Select1st<std::pair<const_int,_State::ClientData>_>,_std::less<int>,_std::allocator<std::pair<const_int,_State::ClientData>_>_>
            ::equal_range(&(this->clients)._M_t,&event->clientId);
    std::
    _Rb_tree<int,_std::pair<const_int,_State::ClientData>,_std::_Select1st<std::pair<const_int,_State::ClientData>_>,_std::less<int>,_std::allocator<std::pair<const_int,_State::ClientData>_>_>
    ::_M_erase_aux(&(this->clients)._M_t,(_Base_ptr)pVar3.first._M_node,
                   (_Base_ptr)pVar3.second._M_node);
    return;
  case MouseMove:
    if (event->clientId != this->curIdControl) {
      return;
    }
    local_38.type = EMousePos;
    local_38._4_4_ = (uint)(uint3)local_38._5_3_ << 8;
    local_38.key = 0x285;
    local_38.mouseButton = -1;
    goto LAB_001065c2;
  case MouseDown:
    if (event->clientId != this->curIdControl) {
      return;
    }
    local_38.mouseButton = event->mouse_but;
    if (local_38.mouseButton == 2) {
      local_38.mouseButton = 1;
    }
    else if (local_38.mouseButton == 1) {
      local_38.mouseButton = 2;
    }
    local_38.isDown = true;
    break;
  case MouseUp:
    if (event->clientId != this->curIdControl) {
      return;
    }
    local_38.mouseButton = event->mouse_but;
    if (local_38.mouseButton == 2) {
      local_38.mouseButton = 1;
    }
    else if (local_38.mouseButton == 1) {
      local_38.mouseButton = 2;
    }
    local_38._4_4_ = (uint)(uint3)local_38._5_3_ << 8;
    break;
  case MouseWheel:
    if (event->clientId != this->curIdControl) {
      return;
    }
    local_38.type = EMouseWheel;
    local_38._4_4_ = (uint)(uint3)local_38._5_3_ << 8;
    local_38.key = 0x285;
    local_38.mouseButton = -1;
    local_38.mousePos.x = 0.0;
    local_38.mousePos.y = 0.0;
    local_38.mouseWheelX = event->wheel_x;
    local_38.mouseWheelY = event->wheel_y;
    goto LAB_001065cd;
  case KeyPress:
    if (event->clientId != this->curIdControl) {
      return;
    }
    std::__cxx11::string::resize((ulong)&this->lastAddText,'\x01');
    *(this->lastAddText)._M_dataplus._M_p = (char)event->key;
    return;
  case KeyDown:
    if (event->clientId != this->curIdControl) {
      return;
    }
    if (event->key < 1) {
      return;
    }
    local_38.key = toImGuiKey(event->key);
    local_38.isDown = true;
    goto LAB_00106567;
  case KeyUp:
    if (event->clientId != this->curIdControl) {
      return;
    }
    if (event->key < 1) {
      return;
    }
    local_38.key = toImGuiKey(event->key);
    local_38._4_4_ = local_38._4_4_ & 0xffffff00;
LAB_00106567:
    local_38.type = EKey;
    local_38.mouseButton = -1;
    local_38.mousePos.x = 0.0;
    local_38.mousePos.y = 0.0;
    local_38.mouseWheelX = 0.0;
    local_38.mouseWheelY = 0.0;
    goto LAB_001065cd;
  default:
    puts("Unknown input event");
    return;
  }
  local_38.type = EMouseButton;
  local_38.key = 0x285;
LAB_001065c2:
  local_38.mousePos.x = event->mouse_x;
  local_38.mousePos.y = event->mouse_y;
  local_38.mouseWheelX = 0.0;
  local_38.mouseWheelY = 0.0;
LAB_001065cd:
  __position._M_current =
       (this->inputEvents).super__Vector_base<State::InputEvent,_std::allocator<State::InputEvent>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  if (__position._M_current ==
      (this->inputEvents).super__Vector_base<State::InputEvent,_std::allocator<State::InputEvent>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::vector<State::InputEvent,_std::allocator<State::InputEvent>_>::
    _M_realloc_insert<State::InputEvent>(&this->inputEvents,__position,&local_38);
  }
  else {
    (__position._M_current)->mousePos = local_38.mousePos;
    (__position._M_current)->mouseWheelX = local_38.mouseWheelX;
    (__position._M_current)->mouseWheelY = local_38.mouseWheelY;
    (__position._M_current)->type = local_38.type;
    (__position._M_current)->isDown = (bool)local_38.isDown;
    *(int3 *)&(__position._M_current)->field_0x5 = local_38._5_3_;
    (__position._M_current)->key = local_38.key;
    (__position._M_current)->mouseButton = local_38.mouseButton;
    ppIVar1 = &(this->inputEvents).
               super__Vector_base<State::InputEvent,_std::allocator<State::InputEvent>_>._M_impl.
               super__Vector_impl_data._M_finish;
    *ppIVar1 = *ppIVar1 + 1;
  }
  return;
}

Assistant:

void State::handle(ImGuiWS::Event && event) {
    switch (event.type) {
        case ImGuiWS::Event::Connected:
            {
                clients[event.clientId].ip = event.ip;
            }
            break;
        case ImGuiWS::Event::Disconnected:
            {
                clients.erase(event.clientId);
            }
            break;
        case ImGuiWS::Event::MouseMove:
            {
                if (event.clientId == curIdControl) {
                    inputEvents.push_back(InputEvent { InputEvent::Type::EMousePos, false, ImGuiKey_COUNT, -1, { event.mouse_x, event.mouse_y }, 0.0f, 0.0f });
                }
            }
            break;
        case ImGuiWS::Event::MouseDown:
            {
                if (event.clientId == curIdControl) {
                    // map the JS button code to Dear ImGui's button code
                    ImGuiMouseButton butImGui = event.mouse_but;
                    switch (event.mouse_but) {
                        case 1: butImGui = ImGuiMouseButton_Middle; break;
                        case 2: butImGui = ImGuiMouseButton_Right; break;
                    }

                    inputEvents.push_back(InputEvent { InputEvent::Type::EMouseButton, true, ImGuiKey_COUNT, butImGui, { event.mouse_x, event.mouse_y }, 0.0f, 0.0f });
                }
            }
            break;
        case ImGuiWS::Event::MouseUp:
            {
                if (event.clientId == curIdControl) {
                    // map the JS button code to Dear ImGui's button code
                    ImGuiMouseButton butImGui = event.mouse_but;
                    switch (event.mouse_but) {
                        case 1: butImGui = ImGuiMouseButton_Middle; break;
                        case 2: butImGui = ImGuiMouseButton_Right; break;
                    }

                    inputEvents.push_back(InputEvent { InputEvent::Type::EMouseButton, false, ImGuiKey_COUNT, butImGui, { event.mouse_x, event.mouse_y }, 0.0f, 0.0f });
                }
            }
            break;
        case ImGuiWS::Event::MouseWheel:
            {
                if (event.clientId == curIdControl) {
                    inputEvents.push_back(InputEvent { InputEvent::Type::EMouseWheel, false, ImGuiKey_COUNT, -1, { }, event.wheel_x, event.wheel_y });
                }
            }
            break;
        case ImGuiWS::Event::KeyUp:
            {
                if (event.clientId == curIdControl) {
                    if (event.key > 0) {
                        ImGuiKey keyImGui = ::toImGuiKey(event.key);
                        inputEvents.push_back(InputEvent { InputEvent::Type::EKey, false, keyImGui, -1, { }, 0.0f, 0.0f });
                    }
                }
            }
            break;
        case ImGuiWS::Event::KeyDown:
            {
                if (event.clientId == curIdControl) {
                    if (event.key > 0) {
                        ImGuiKey keyImGui = ::toImGuiKey(event.key);
                        inputEvents.push_back(InputEvent { InputEvent::Type::EKey, true, keyImGui, -1, { }, 0.0f, 0.0f });
                    }
                }
            }
            break;
        case ImGuiWS::Event::KeyPress:
            {
                if (event.clientId == curIdControl) {
                    lastAddText.resize(1);
                    lastAddText[0] = event.key;
                }
            }
            break;
        default:
            {
                printf("Unknown input event\n");
            }
    }
}